

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

uint64_t protozero::detail::decode_varint_impl(char **data,char *end)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  varint_too_long_exception *this;
  end_of_buffer_exception *this_00;
  bool bVar6;
  uint shift;
  int64_t b;
  uint64_t val;
  int8_t *p;
  int8_t *iend;
  int8_t *begin;
  char *end_local;
  char **data_local;
  
  pcVar2 = *data;
  b = 0;
  if ((long)end - (long)pcVar2 < 10) {
    bVar3 = 0;
    val = (uint64_t)pcVar2;
    while( true ) {
      bVar6 = false;
      if ((char *)val != end) {
        bVar6 = *(char *)val < '\0';
      }
      if (!bVar6) break;
      b = ((long)*(char *)val & 0x7fU) << (bVar3 & 0x3f) | b;
      bVar3 = bVar3 + 7;
      val = val + 1;
    }
    if ((char *)val == end) {
      this_00 = (end_of_buffer_exception *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      end_of_buffer_exception::end_of_buffer_exception(this_00);
      __cxa_throw(this_00,&end_of_buffer_exception::typeinfo,
                  end_of_buffer_exception::~end_of_buffer_exception);
    }
    b = (long)*(char *)val << (bVar3 & 0x3f) | b;
    val = val + 1;
  }
  else {
    val = (uint64_t)(pcVar2 + 1);
    b = (long)*pcVar2 & 0x7f;
    if ((long)*pcVar2 < 0) {
      cVar1 = *(char *)val;
      b = ((long)cVar1 & 0x7fU) << 7 | b;
      val = (uint64_t)(pcVar2 + 2);
      if ((long)cVar1 < 0) {
        uVar4 = (ulong)pcVar2[2];
        b = (uVar4 & 0x7f) << 0xe | b;
        val = (uint64_t)(pcVar2 + 3);
        if ((long)uVar4 < 0) {
          uVar4 = (ulong)pcVar2[3];
          b = (uVar4 & 0x7f) << 0x15 | b;
          val = (uint64_t)(pcVar2 + 4);
          if ((long)uVar4 < 0) {
            uVar4 = (ulong)pcVar2[4];
            b = (uVar4 & 0x7f) << 0x1c | b;
            val = (uint64_t)(pcVar2 + 5);
            if ((long)uVar4 < 0) {
              uVar4 = (ulong)pcVar2[5];
              b = (uVar4 & 0x7f) << 0x23 | b;
              val = (uint64_t)(pcVar2 + 6);
              if ((long)uVar4 < 0) {
                uVar4 = (ulong)pcVar2[6];
                b = (uVar4 & 0x7f) << 0x2a | b;
                val = (uint64_t)(pcVar2 + 7);
                if ((long)uVar4 < 0) {
                  uVar4 = (ulong)pcVar2[7];
                  b = (uVar4 & 0x7f) << 0x31 | b;
                  val = (uint64_t)(pcVar2 + 8);
                  if ((long)uVar4 < 0) {
                    uVar4 = (ulong)pcVar2[8];
                    b = (uVar4 & 0x7f) << 0x38 | b;
                    val = (uint64_t)(pcVar2 + 9);
                    if ((long)uVar4 < 0) {
                      lVar5 = (long)pcVar2[9];
                      b = lVar5 << 0x3f | b;
                      val = (uint64_t)(pcVar2 + 10);
                      if (lVar5 < 0) {
                        this = (varint_too_long_exception *)__cxa_allocate_exception(8);
                        memset(this,0,8);
                        varint_too_long_exception::varint_too_long_exception(this);
                        __cxa_throw(this,&varint_too_long_exception::typeinfo,
                                    varint_too_long_exception::~varint_too_long_exception);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *data = (char *)val;
  return b;
}

Assistant:

inline uint64_t decode_varint_impl(const char** data, const char* end) {
        const auto* begin = reinterpret_cast<const int8_t*>(*data);
        const auto* iend = reinterpret_cast<const int8_t*>(end);
        const int8_t* p = begin;
        uint64_t val = 0;

        if (iend - begin >= max_varint_length) {  // fast path
            do {
                int64_t b = *p++;
                          val  = ((static_cast<uint64_t>(b) & 0x7fU)       ); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) <<  7U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 14U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 21U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 28U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 35U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 42U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 49U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x7fU) << 56U); if (b >= 0) { break; }
                b = *p++; val |= ((static_cast<uint64_t>(b) & 0x01U) << 63U); if (b >= 0) { break; }
                throw varint_too_long_exception{};
            } while (false);
        } else {
            unsigned int shift = 0;
            while (p != iend && *p < 0) {
                val |= (static_cast<uint64_t>(*p++) & 0x7fU) << shift;
                shift += 7;
            }
            if (p == iend) {
                throw end_of_buffer_exception{};
            }
            val |= static_cast<uint64_t>(*p++) << shift;
        }

        *data = reinterpret_cast<const char*>(p);
        return val;
    }